

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_4::Validator::OnAtomicRmwExpr(Validator *this,AtomicRmwExpr *expr)

{
  Address alignment;
  Var local_70;
  Opcode local_28;
  Enum local_24;
  AtomicRmwExpr *local_20;
  AtomicRmwExpr *expr_local;
  Validator *this_local;
  
  local_28.enum_ = (expr->opcode).enum_;
  local_20 = expr;
  expr_local = (AtomicRmwExpr *)this;
  Var::Var(&local_70,&(expr->super_MemoryExpr<(wabt::ExprType)1>).memidx);
  alignment = Opcode::GetAlignment(&local_20->opcode,local_20->align);
  local_24 = (Enum)SharedValidator::OnAtomicRmw
                             (&this->validator_,
                              &(expr->super_MemoryExpr<(wabt::ExprType)1>).
                               super_ExprMixin<(wabt::ExprType)1>.super_Expr.loc,local_28,&local_70,
                              alignment,local_20->offset);
  Result::operator|=(&this->result_,(Result)local_24);
  Var::~Var(&local_70);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnAtomicRmwExpr(AtomicRmwExpr* expr) {
  result_ |= validator_.OnAtomicRmw(expr->loc, expr->opcode, expr->memidx,
                                    expr->opcode.GetAlignment(expr->align),
                                    expr->offset);
  return Result::Ok;
}